

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_dense.c
# Opt level: O2

int check_vector(N_Vector x,N_Vector y,sunrealtype tol)

{
  double dVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  
  lVar5 = N_VGetArrayPointer();
  lVar6 = N_VGetArrayPointer(y);
  uVar7 = N_VGetLength(x);
  uVar8 = N_VGetLength(y);
  if (uVar7 == uVar8) {
    uVar8 = 0;
    if ((long)uVar7 < 1) {
      uVar7 = uVar8;
    }
    for (uVar10 = 0; iVar9 = (int)uVar8, uVar7 != uVar10; uVar10 = uVar10 + 1) {
      iVar3 = SUNRCompareTol(*(undefined8 *)(lVar5 + uVar10 * 8),*(undefined8 *)(lVar6 + uVar10 * 8)
                             ,tol);
      uVar8 = (ulong)(uint)(iVar9 + iVar3);
    }
    if (0 < iVar9) {
      puts("Check_vector failures:");
      for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        iVar3 = SUNRCompareTol(*(undefined8 *)(lVar5 + uVar8 * 8),*(undefined8 *)(lVar6 + uVar8 * 8)
                               ,tol);
        if (iVar3 != 0) {
          dVar1 = *(double *)(lVar5 + uVar8 * 8);
          dVar2 = *(double *)(lVar6 + uVar8 * 8);
          printf("  xdata[%ld] = %g != %g (err = %g)\n",dVar1,dVar2,ABS(dVar1 - dVar2),uVar8);
        }
      }
    }
    uVar4 = (uint)(0 < iVar9);
  }
  else {
    puts(">>> ERROR: check_vector: Different data array lengths ");
    uVar4 = 1;
  }
  return uVar4;
}

Assistant:

int check_vector(N_Vector x, N_Vector y, sunrealtype tol)
{
  int failure = 0;
  sunrealtype *xdata, *ydata;
  sunindextype xldata, yldata;
  sunindextype i;

  /* get vector data */
  xdata = N_VGetArrayPointer(x);
  ydata = N_VGetArrayPointer(y);

  /* check data lengths */
  xldata = N_VGetLength(x);
  yldata = N_VGetLength(y);

  if (xldata != yldata)
  {
    printf(">>> ERROR: check_vector: Different data array lengths \n");
    return (1);
  }

  /* check vector data */
  for (i = 0; i < xldata; i++)
  {
    failure += SUNRCompareTol(xdata[i], ydata[i], tol);
  }

  if (failure > ZERO)
  {
    printf("Check_vector failures:\n");
    for (i = 0; i < xldata; i++)
    {
      if (SUNRCompareTol(xdata[i], ydata[i], tol) != 0)
      {
        printf("  xdata[%ld] = %" GSYM " != %" GSYM " (err = %" GSYM ")\n",
               (long int)i, xdata[i], ydata[i], SUNRabs(xdata[i] - ydata[i]));
      }
    }
  }

  if (failure > ZERO) { return (1); }
  else { return (0); }
}